

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::HardSwish_x86_avx2::forward_inplace(HardSwish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  undefined1 (*pauVar14) [32];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  
  uVar13 = bottom_top_blob->c;
  uVar9 = (ulong)uVar13;
  uVar8 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar13) {
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      uVar11 = 0;
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      auVar17._16_4_ = 0x3f800000;
      auVar17._20_4_ = 0x3f800000;
      auVar17._24_4_ = 0x3f800000;
      auVar17._28_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar8) {
          pauVar14 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar13 = uVar8;
          do {
            uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
            auVar20._4_4_ = uVar1;
            auVar20._0_4_ = uVar1;
            auVar20._8_4_ = uVar1;
            auVar20._12_4_ = uVar1;
            auVar20._16_4_ = uVar1;
            auVar20._20_4_ = uVar1;
            auVar20._24_4_ = uVar1;
            auVar20._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
            auVar23._4_4_ = uVar1;
            auVar23._0_4_ = uVar1;
            auVar23._8_4_ = uVar1;
            auVar23._12_4_ = uVar1;
            auVar23._16_4_ = uVar1;
            auVar23._20_4_ = uVar1;
            auVar23._24_4_ = uVar1;
            auVar23._28_4_ = uVar1;
            auVar18 = *pauVar14;
            auVar16 = vfmadd213ps_fma(auVar23,auVar18,auVar20);
            auVar20 = vmaxps_avx(ZEXT1632(auVar16),ZEXT832(0));
            auVar20 = vminps_avx(auVar20,auVar17);
            auVar6._4_4_ = auVar20._4_4_ * auVar18._4_4_;
            auVar6._0_4_ = auVar20._0_4_ * auVar18._0_4_;
            auVar6._8_4_ = auVar20._8_4_ * auVar18._8_4_;
            auVar6._12_4_ = auVar20._12_4_ * auVar18._12_4_;
            auVar6._16_4_ = auVar20._16_4_ * auVar18._16_4_;
            auVar6._20_4_ = auVar20._20_4_ * auVar18._20_4_;
            auVar6._24_4_ = auVar20._24_4_ * auVar18._24_4_;
            auVar6._28_4_ = auVar20._28_4_;
            *pauVar14 = auVar6;
            pauVar14 = pauVar14 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar9);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar13) {
      pp_Var4 = this->_vptr_HardSwish_x86_avx2;
      uVar11 = 0;
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar8) {
          pauVar12 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar13 = uVar8;
          do {
            auVar3 = *pauVar12;
            uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
            auVar22._4_4_ = uVar1;
            auVar22._0_4_ = uVar1;
            auVar22._8_4_ = uVar1;
            auVar22._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
            auVar25._4_4_ = uVar1;
            auVar25._0_4_ = uVar1;
            auVar25._8_4_ = uVar1;
            auVar25._12_4_ = uVar1;
            auVar22 = vfmadd213ps_fma(auVar25,auVar3,auVar22);
            auVar22 = vmaxps_avx(auVar22,ZEXT816(0));
            auVar22 = vminps_avx(auVar22,auVar16);
            auVar19._0_4_ = auVar22._0_4_ * auVar3._0_4_;
            auVar19._4_4_ = auVar22._4_4_ * auVar3._4_4_;
            auVar19._8_4_ = auVar22._8_4_ * auVar3._8_4_;
            auVar19._12_4_ = auVar22._12_4_ * auVar3._12_4_;
            *pauVar12 = auVar19;
            pauVar12 = pauVar12 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar9);
    }
  }
  else if (0 < (int)uVar13) {
    pp_Var4 = this->_vptr_HardSwish_x86_avx2;
    uVar11 = 0;
    auVar18._8_4_ = 0x3f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar18._12_4_ = 0x3f800000;
    auVar18._16_4_ = 0x3f800000;
    auVar18._20_4_ = 0x3f800000;
    auVar18._24_4_ = 0x3f800000;
    auVar18._28_4_ = 0x3f800000;
    do {
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar8 < 8) {
        uVar13 = 0;
      }
      else {
        iVar15 = 7;
        do {
          auVar17 = *pauVar14;
          p_Var5 = pp_Var4[-3];
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)p_Var5);
          auVar24._4_4_ = uVar1;
          auVar24._0_4_ = uVar1;
          auVar24._8_4_ = uVar1;
          auVar24._12_4_ = uVar1;
          auVar24._16_4_ = uVar1;
          auVar24._20_4_ = uVar1;
          auVar24._24_4_ = uVar1;
          auVar24._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)p_Var5);
          auVar26._4_4_ = uVar1;
          auVar26._0_4_ = uVar1;
          auVar26._8_4_ = uVar1;
          auVar26._12_4_ = uVar1;
          auVar26._16_4_ = uVar1;
          auVar26._20_4_ = uVar1;
          auVar26._24_4_ = uVar1;
          auVar26._28_4_ = uVar1;
          auVar16 = vfmadd213ps_fma(auVar26,auVar17,auVar24);
          auVar20 = vmaxps_avx(ZEXT1632(auVar16),ZEXT832(0));
          auVar20 = vminps_avx(auVar20,auVar18);
          auVar7._4_4_ = auVar20._4_4_ * auVar17._4_4_;
          auVar7._0_4_ = auVar20._0_4_ * auVar17._0_4_;
          auVar7._8_4_ = auVar20._8_4_ * auVar17._8_4_;
          auVar7._12_4_ = auVar20._12_4_ * auVar17._12_4_;
          auVar7._16_4_ = auVar20._16_4_ * auVar17._16_4_;
          auVar7._20_4_ = auVar20._20_4_ * auVar17._20_4_;
          auVar7._24_4_ = auVar20._24_4_ * auVar17._24_4_;
          auVar7._28_4_ = auVar17._28_4_;
          *pauVar14 = auVar7;
          pauVar14 = pauVar14 + 1;
          iVar15 = iVar15 + 8;
          uVar13 = uVar8 & 0xfffffff8;
        } while (iVar15 < (int)uVar8);
      }
      if (uVar8 - uVar13 != 0 && (int)uVar13 <= (int)uVar8) {
        lVar10 = 0;
        do {
          fVar2 = *(float *)(*pauVar14 + lVar10 * 4);
          p_Var5 = pp_Var4[-3];
          fVar21 = 0.0;
          if (fVar2 < *(float *)(&this->field_0xd8 + (long)p_Var5)) {
LAB_002f835c:
            *(float *)(*pauVar14 + lVar10 * 4) = fVar21;
          }
          else if (fVar2 <= *(float *)(&this->field_0xdc + (long)p_Var5)) {
            auVar16 = vfmadd213ss_fma(ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var5)),
                                      ZEXT416((uint)fVar2),
                                      ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var5)));
            fVar21 = auVar16._0_4_ * fVar2;
            goto LAB_002f835c;
          }
          lVar10 = lVar10 + 1;
        } while (uVar8 - uVar13 != (int)lVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar9);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}